

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

void __thiscall
icu_63::double_conversion::Bignum::AssignDecimalString(Bignum *this,Vector<const_char> value)

{
  uint64_t uVar1;
  int in_R8D;
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  uint64_t digits;
  uint64_t digits_1;
  int local_28;
  uint pos;
  int length;
  int kMaxUint64DecimalDigits;
  Bignum *this_local;
  Vector<const_char> value_local;
  
  this_local = (Bignum *)value.start_;
  value_local.start_._0_4_ = value.length_;
  Zero(this);
  local_28 = Vector<const_char>::length((Vector<const_char> *)&this_local);
  digits_1._4_4_ = 0;
  while (0x12 < local_28) {
    buffer.length_ = digits_1._4_4_;
    buffer.start_ = (char *)(ulong)(uint)value_local.start_;
    buffer._12_4_ = 0;
    uVar1 = ReadUInt64((double_conversion *)this_local,buffer,0x13,in_R8D);
    digits_1._4_4_ = digits_1._4_4_ + 0x13;
    local_28 = local_28 + -0x13;
    MultiplyByPowerOfTen(this,0x13);
    AddUInt64(this,uVar1);
  }
  buffer_00.length_ = digits_1._4_4_;
  buffer_00.start_ = (char *)(ulong)(uint)value_local.start_;
  buffer_00._12_4_ = 0;
  uVar1 = ReadUInt64((double_conversion *)this_local,buffer_00,local_28,in_R8D);
  MultiplyByPowerOfTen(this,local_28);
  AddUInt64(this,uVar1);
  Clamp(this);
  return;
}

Assistant:

void Bignum::AssignDecimalString(Vector<const char> value) {
  // 2^64 = 18446744073709551616 > 10^19
  const int kMaxUint64DecimalDigits = 19;
  Zero();
  int length = value.length();
  unsigned int pos = 0;
  // Let's just say that each digit needs 4 bits.
  while (length >= kMaxUint64DecimalDigits) {
    uint64_t digits = ReadUInt64(value, pos, kMaxUint64DecimalDigits);
    pos += kMaxUint64DecimalDigits;
    length -= kMaxUint64DecimalDigits;
    MultiplyByPowerOfTen(kMaxUint64DecimalDigits);
    AddUInt64(digits);
  }
  uint64_t digits = ReadUInt64(value, pos, length);
  MultiplyByPowerOfTen(length);
  AddUInt64(digits);
  Clamp();
}